

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::FunctionParam<void()>::
FunctionParam<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__2>
          (FunctionParam<void()> *this,Type *func)

{
  Type *func_local;
  FunctionParam<void_()> *this_local;
  
  ctor<kj::FunctionParam<void()>::Wrapper<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__2>,kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__2&>
            ((Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2038:32)>
              *)this,func);
  return;
}

Assistant:

FunctionParam(Func&& func) {
    typedef Wrapper<Decay<Func>> WrapperType;

    // All instances of Wrapper<Func> are two pointers in size: a vtable, and a Func&. So if we
    // allocate space for two pointers, we can construct a Wrapper<Func> in it!
    static_assert(sizeof(WrapperType) == sizeof(space),
        "expected WrapperType to be two pointers");

    // Even if `func` is an rvalue reference, it's OK to use it as an lvalue here, because
    // FunctionParam is used strictly for parameters. If we captured a temporary, we know that
    // temporary will not be destroyed until after the function call completes.
    ctor(*reinterpret_cast<WrapperType*>(space), func);
  }